

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O3

void __thiscall puppup::Game::ply(Game *this,Move m,bool fill_rack)

{
  long *plVar1;
  pointer pvVar2;
  long *plVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  const_iterator __begin2;
  long *plVar8;
  long lVar9;
  array<long,_32UL> *container;
  long *plVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  
  if (this->winner_ == -1) {
    if (m.word != -1) {
      lVar7 = this->turn_;
      pvVar2 = (this->gaddag_->words_).
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar8 = *(long **)&pvVar2[m.word].super__Vector_base<long,_std::allocator<long>_>._M_impl;
      plVar3 = *(pointer *)
                ((long)&pvVar2[m.word].super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
      if (plVar8 != plVar3) {
        plVar10 = (long *)(m.cursor * 8 + ((ulong)((long)plVar3 - (long)plVar8) >> 3) * m.step * -8
                           + 0x20 + (long)this);
        do {
          if (*plVar10 == 0x1b) {
            lVar9 = *plVar8;
            *plVar10 = lVar9;
            plVar10[0x100] = (&scores)[lVar9];
            plVar1 = (this->racks_)._M_elems[lVar7]._M_elems + lVar9;
            *plVar1 = *plVar1 + -1;
          }
          plVar8 = plVar8 + 1;
          plVar10 = plVar10 + m.step;
        } while (plVar8 != plVar3);
      }
      if (m.blanks != 0) {
        do {
          (this->state_).letter_score._M_elems[(m.blanks & 0xffffU) - 1] = 0;
          plVar8 = (this->racks_)._M_elems[lVar7]._M_elems + 0x1a;
          *plVar8 = *plVar8 + -1;
          plVar8 = (this->racks_)._M_elems[lVar7]._M_elems +
                   (this->state_).board._M_elems[(m.blanks & 0xffffU) - 1];
          *plVar8 = *plVar8 + 1;
          bVar11 = 0xffff < (ulong)m.blanks;
          m.blanks = m.blanks >> 0x10;
        } while (bVar11);
      }
      lVar9 = 0;
      do {
        lVar4 = (this->racks_)._M_elems[lVar7]._M_elems[lVar9];
        if (lVar4 < 0) {
          plVar8 = (this->population_)._M_elems + lVar9;
          *plVar8 = *plVar8 + lVar4;
          (this->racks_)._M_elems[lVar7]._M_elems[lVar9] = 0;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      (this->state_).score = (this->state_).score + m.score;
    }
    if (fill_rack) {
      container = (this->racks_)._M_elems + this->turn_;
      if (this->out_of_tiles_ == true) {
        auVar13 = ZEXT1664((undefined1  [16])0x0);
        lVar7 = 0;
        do {
          auVar13 = vpaddq_avx512f(auVar13,*(undefined1 (*) [64])(container->_M_elems + lVar7));
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x20);
        auVar12 = vextracti64x4_avx512f(auVar13,1);
        auVar13 = vpaddq_avx512f(auVar13,ZEXT3264(auVar12));
        auVar5 = vpaddq_avx(auVar13._0_16_,auVar13._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpaddq_avx(auVar5,auVar6);
        if (auVar5._0_8_ == 0) {
          checkWinner(this);
          return;
        }
      }
      else {
        fillRack<std::array<long,32ul>>(this,container);
      }
    }
    auVar5._0_8_ = this->turn_;
    auVar5._8_8_ = (this->state_).score;
    auVar6 = vpsubq_avx((undefined1  [16])0x0,auVar5);
    auVar5 = vpblendd_avx2(auVar5 ^ SUB6416(ZEXT864(1),0),auVar6,0xc);
    this->turn_ = auVar5._0_8_;
    (this->state_).score = auVar5._8_8_;
  }
  return;
}

Assistant:

void ply(movegen::Move m, const bool fill_rack = true) {
        if (winner_ != -1) {
            return;
        }
        movegen::makeMove(state_, racks_[turn_], population_, m, gaddag_);
        if (fill_rack) {
            if (!out_of_tiles_) {
                fillRack(racks_[turn_]);
            } else if (!std::accumulate(racks_[turn_].begin(),
                                        racks_[turn_].end(), idx(0))) {
                checkWinner();
                return;
            }
        }
        turn_ ^= 1;
        state_.score *= -1;
    }